

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-splitting.cpp
# Opt level: O3

Results * wasm::ModuleSplitting::splitFunctions
                    (Results *__return_storage_ptr__,Module *primary,Config *config)

{
  _Rb_tree_impl<std::less<unsigned_long>,_true> *p_Var1;
  _Base_ptr p_Var2;
  _Link_type __x;
  undefined1 local_1b0 [8];
  ModuleSplitter split;
  
  anon_unknown_0::ModuleSplitter::ModuleSplitter((ModuleSplitter *)local_1b0,primary,config);
  (__return_storage_ptr__->secondary)._M_t.
  super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
  super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl = (Module *)split.config;
  split.config = (Config *)0x0;
  p_Var2 = &(__return_storage_ptr__->placeholderMap)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (split.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ == 0) {
    (__return_storage_ptr__->placeholderMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
         = (_Base_ptr)0x0;
    p_Var1 = (_Rb_tree_impl<std::less<unsigned_long>,_true> *)
             &(__return_storage_ptr__->placeholderMap)._M_t._M_impl.super__Rb_tree_header;
    split.placeholderMap._M_t._M_impl._0_4_ = _S_red;
    __x = (_Link_type)p_Var2;
  }
  else {
    (__return_storage_ptr__->placeholderMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
         = (_Base_ptr)split.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
    *(_Base_ptr *)(split.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 8) =
         p_Var2;
    p_Var1 = &split.placeholderMap._M_t._M_impl;
    (__return_storage_ptr__->placeholderMap)._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)split.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    split.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    split.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    p_Var2 = split.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    __x = (_Link_type)split.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    split.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&split.placeholderMap;
    split.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)&split.placeholderMap;
  }
  (__return_storage_ptr__->placeholderMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       p_Var2;
  (__return_storage_ptr__->placeholderMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &__x->super__Rb_tree_node_base;
  *(_Base_ptr *)((long)&(p_Var1->super__Rb_tree_header)._M_header + 0x18) = (_Base_ptr)0x0;
  (__return_storage_ptr__->placeholderMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       split.placeholderMap._M_t._M_impl._0_4_;
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_wasm::Name>,_std::_Select1st<std::pair<const_unsigned_long,_wasm::Name>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wasm::Name>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_wasm::Name>,_std::_Select1st<std::pair<const_unsigned_long,_wasm::Name>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wasm::Name>_>_>
               *)&split.exportedPrimaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
               *)&split.minified);
  if (split.tableManager.funcIndices._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    __x = (_Link_type)
          ((long)split.tableManager.activeTableSegments.
                 super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          split.tableManager.funcIndices._M_t._M_impl.super__Rb_tree_header._M_node_count);
    operator_delete((void *)split.tableManager.funcIndices._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,(ulong)__x);
  }
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::ModuleSplitting::(anonymous_namespace)::TableSlotManager::Slot>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::ModuleSplitting::(anonymous_namespace)::TableSlotManager::Slot>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::ModuleSplitting::(anonymous_namespace)::TableSlotManager::Slot>_>_>
  ::_M_erase((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::ModuleSplitting::(anonymous_namespace)::TableSlotManager::Slot>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::ModuleSplitting::(anonymous_namespace)::TableSlotManager::Slot>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::ModuleSplitting::(anonymous_namespace)::TableSlotManager::Slot>_>_>
              *)split.tableManager.funcIndices._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,
             __x);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&split.classifiedFuncs.first._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&split.secondary);
  std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::~unique_ptr
            ((unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> *)&split);
  return __return_storage_ptr__;
}

Assistant:

Results splitFunctions(Module& primary, const Config& config) {
  ModuleSplitter split(primary, config);
  return {std::move(split.secondaryPtr), std::move(split.placeholderMap)};
}